

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reshape.cpp
# Opt level: O2

int __thiscall ncnn::Reshape::forward(Reshape *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  void *pvVar3;
  size_t sVar4;
  size_t sVar5;
  byte bVar6;
  Mat *pMVar7;
  byte bVar8;
  byte bVar9;
  int i_2;
  uint _w;
  uint _c;
  int iVar10;
  ulong uVar11;
  byte bVar12;
  uint uVar13;
  Allocator *pAVar14;
  ulong uVar15;
  size_t sVar16;
  uint uVar17;
  undefined4 *puVar18;
  int iVar19;
  uint _h;
  ulong uVar20;
  undefined4 *puVar21;
  long lVar22;
  ulong uVar23;
  int i;
  int iVar24;
  ulong uVar25;
  int i_1;
  ulong uVar26;
  undefined4 *puVar27;
  int i_3;
  uint uVar28;
  ulong uVar29;
  undefined4 *puVar30;
  ulong uVar31;
  int *piVar32;
  size_t sVar33;
  bool bVar34;
  undefined4 *local_118;
  ulong local_108;
  Mat local_e8;
  uint local_9c;
  Allocator *local_98;
  Mat *local_90;
  size_t local_88;
  Mat local_80;
  ulong local_38;
  
  sVar16 = bottom_blob->elemsize;
  uVar17 = bottom_blob->w;
  uVar28 = bottom_blob->h;
  uVar1 = bottom_blob->d;
  uVar2 = bottom_blob->c;
  uVar13 = uVar1 * uVar2 * uVar28 * uVar17;
  iVar10 = bottom_blob->dims;
  _w = this->w;
  _h = this->h;
  local_108 = (ulong)(uint)this->d;
  _c = this->c;
  iVar19 = this->ndim;
  local_88 = sVar16;
  if (iVar19 == 1) {
    if (_w == 0) {
      _w = uVar17;
    }
    if (_w == 0xffffffff) {
      _w = uVar13;
    }
    bVar9 = 0;
    if (iVar10 == 1) {
      bVar12 = 0;
      bVar6 = 0;
      if (uVar17 == _w) {
LAB_002fa898:
        if (top_blob != bottom_blob) {
          piVar32 = bottom_blob->refcount;
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + 1;
            UNLOCK();
          }
          piVar32 = top_blob->refcount;
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + -1;
            UNLOCK();
            if (*piVar32 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->c = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          piVar32 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar32;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar10 = bottom_blob->w;
          iVar19 = bottom_blob->h;
          iVar24 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar10;
          top_blob->h = iVar19;
          top_blob->d = iVar24;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
          return 0;
        }
        return 0;
      }
    }
    else {
LAB_002faaef:
      bVar6 = 0;
      bVar8 = 0;
LAB_002faaf1:
      bVar12 = bVar8;
      bVar9 = bVar6;
      bVar6 = 0;
    }
  }
  else {
    if (iVar19 == 4) {
      if (_w == 0) {
        _w = uVar17;
      }
      if (_h == 0) {
        _h = uVar28;
      }
      if (_c == 0) {
        _c = uVar2;
      }
      if (this->d == 0) {
        local_108 = (ulong)uVar1;
      }
      if (_w == 0xffffffff) {
        uVar15 = (long)((ulong)(uint)((int)((long)(int)uVar13 / (long)(int)_c) >> 0x1f) << 0x20 |
                       (long)(int)uVar13 / (long)(int)_c & 0xffffffffU) / (long)(int)local_108;
        _w = (uint)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff) /
                   (long)(int)_h);
      }
      if (_h == 0xffffffff) {
        uVar15 = (long)((ulong)(uint)((int)((long)(int)uVar13 / (long)(int)_c) >> 0x1f) << 0x20 |
                       (long)(int)uVar13 / (long)(int)_c & 0xffffffffU) / (long)(int)local_108;
        _h = (uint)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff) /
                   (long)(int)_w);
      }
      if ((int)local_108 == -1) {
        uVar15 = (long)((ulong)(uint)((int)((long)(int)uVar13 / (long)(int)_c) >> 0x1f) << 0x20 |
                       (long)(int)uVar13 / (long)(int)_c & 0xffffffffU) / (long)(int)_h;
        local_108 = (long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff) /
                    (long)(int)_w & 0xffffffff;
      }
      if (_c == 0xffffffff) {
        uVar15 = (long)((ulong)(uint)((int)((long)(int)uVar13 / (long)(int)local_108) >> 0x1f) <<
                        0x20 | (long)(int)uVar13 / (long)(int)local_108 & 0xffffffffU) /
                 (long)(int)_h;
        _c = (uint)((long)((ulong)(uint)((int)uVar15 >> 0x1f) << 0x20 | uVar15 & 0xffffffff) /
                   (long)(int)_w);
      }
      bVar6 = 1;
      bVar8 = 0;
      if ((iVar10 == 4) && (uVar2 == _c)) {
        if (top_blob != bottom_blob) {
          piVar32 = bottom_blob->refcount;
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + 1;
            UNLOCK();
          }
          piVar32 = top_blob->refcount;
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + -1;
            UNLOCK();
            if (*piVar32 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->c = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          piVar32 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar32;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar10 = bottom_blob->w;
          iVar19 = bottom_blob->h;
          iVar24 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar10;
          top_blob->h = iVar19;
          top_blob->d = iVar24;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        top_blob->w = _w;
        top_blob->h = _h;
        top_blob->d = (int)local_108;
        return 0;
      }
      goto LAB_002faaf1;
    }
    if (iVar19 == 3) {
      if (_w == 0) {
        _w = uVar17;
      }
      if (_h == 0) {
        _h = uVar28;
      }
      if (_c == 0) {
        _c = uVar2;
      }
      if (_w == 0xffffffff) {
        _w = (uint)((long)((ulong)(uint)((int)((long)(int)uVar13 / (long)(int)_c) >> 0x1f) << 0x20 |
                          (long)(int)uVar13 / (long)(int)_c & 0xffffffffU) / (long)(int)_h);
      }
      if (_h == 0xffffffff) {
        _h = (uint)((long)((ulong)(uint)((int)((long)(int)uVar13 / (long)(int)_c) >> 0x1f) << 0x20 |
                          (long)(int)uVar13 / (long)(int)_c & 0xffffffffU) / (long)(int)_w);
      }
      if (_c == 0xffffffff) {
        _c = (uint)((long)((ulong)(uint)((int)((long)(int)uVar13 / (long)(int)_h) >> 0x1f) << 0x20 |
                          (long)(int)uVar13 / (long)(int)_h & 0xffffffffU) / (long)(int)_w);
      }
      bVar9 = 0;
      bVar6 = 1;
      if ((iVar10 == 3) && (uVar2 == _c)) {
        if (top_blob != bottom_blob) {
          piVar32 = bottom_blob->refcount;
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + 1;
            UNLOCK();
          }
          piVar32 = top_blob->refcount;
          if (piVar32 != (int *)0x0) {
            LOCK();
            *piVar32 = *piVar32 + -1;
            UNLOCK();
            if (*piVar32 == 0) {
              if (top_blob->allocator == (Allocator *)0x0) {
                free(top_blob->data);
              }
              else {
                (*top_blob->allocator->_vptr_Allocator[3])();
              }
            }
          }
          top_blob->cstep = 0;
          top_blob->data = (void *)0x0;
          top_blob->refcount = (int *)0x0;
          *(undefined8 *)((long)&top_blob->refcount + 4) = 0;
          *(undefined8 *)((long)&top_blob->elemsize + 4) = 0;
          top_blob->c = 0;
          top_blob->dims = 0;
          top_blob->w = 0;
          top_blob->h = 0;
          top_blob->d = 0;
          piVar32 = bottom_blob->refcount;
          top_blob->data = bottom_blob->data;
          top_blob->refcount = piVar32;
          top_blob->elemsize = bottom_blob->elemsize;
          top_blob->elempack = bottom_blob->elempack;
          top_blob->allocator = bottom_blob->allocator;
          iVar10 = bottom_blob->w;
          iVar19 = bottom_blob->h;
          iVar24 = bottom_blob->d;
          top_blob->dims = bottom_blob->dims;
          top_blob->w = iVar10;
          top_blob->h = iVar19;
          top_blob->d = iVar24;
          top_blob->c = bottom_blob->c;
          top_blob->cstep = bottom_blob->cstep;
        }
        top_blob->w = _w;
        top_blob->h = _h;
        return 0;
      }
      bVar12 = 0;
    }
    else {
      if (iVar19 != 2) goto LAB_002faaef;
      if (_w == 0) {
        _w = uVar17;
      }
      if (_h == 0) {
        _h = uVar28;
      }
      if (_w == 0xffffffff) {
        _w = (int)uVar13 / (int)_h;
      }
      if (_h == 0xffffffff) {
        _h = (int)uVar13 / (int)_w;
      }
      bVar9 = 0;
      bVar12 = 1;
      bVar6 = 0;
      bVar8 = 1;
      if (iVar10 != 2) goto LAB_002faaf1;
      bVar6 = 0;
      if (uVar28 == _h) goto LAB_002fa898;
    }
  }
  iVar24 = (int)local_108;
  local_9c = _w;
  local_90 = top_blob;
  if ((((bool)((iVar10 == 4 & bVar9 | iVar10 == 3 & bVar6) & uVar2 == _c)) ||
      ((bool)(iVar10 == 2 & bVar12 & uVar28 == _h))) || (this->permute != 1)) {
    if (iVar19 == 1) {
      Mat::reshape(&local_e8,bottom_blob,_w,opt->blob_allocator);
      if (&local_e8 != top_blob) {
        if (local_e8.refcount != (int *)0x0) {
          LOCK();
          *local_e8.refcount = *local_e8.refcount + 1;
          UNLOCK();
        }
        piVar32 = top_blob->refcount;
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_e8.data;
        top_blob->refcount = local_e8.refcount;
        top_blob->elemsize = local_e8.elemsize;
        top_blob->elempack = local_e8.elempack;
        top_blob->allocator = local_e8.allocator;
        top_blob->dims = local_e8.dims;
        top_blob->w = local_e8.w;
        top_blob->h = local_e8.h;
        top_blob->d = local_e8.d;
        top_blob->c = local_e8.c;
        top_blob->cstep = local_e8.cstep;
      }
      if (local_e8.refcount != (int *)0x0) {
        LOCK();
        *local_e8.refcount = *local_e8.refcount + -1;
        UNLOCK();
        if (*local_e8.refcount == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            free(local_e8.data);
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar19 = this->ndim;
    }
    if (iVar19 == 2) {
      Mat::reshape(&local_e8,bottom_blob,_w,_h,opt->blob_allocator);
      if (&local_e8 != top_blob) {
        if (local_e8.refcount != (int *)0x0) {
          LOCK();
          *local_e8.refcount = *local_e8.refcount + 1;
          UNLOCK();
        }
        piVar32 = top_blob->refcount;
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_e8.data;
        top_blob->refcount = local_e8.refcount;
        top_blob->elemsize = local_e8.elemsize;
        top_blob->elempack = local_e8.elempack;
        top_blob->allocator = local_e8.allocator;
        top_blob->dims = local_e8.dims;
        top_blob->w = local_e8.w;
        top_blob->h = local_e8.h;
        top_blob->d = local_e8.d;
        top_blob->c = local_e8.c;
        top_blob->cstep = local_e8.cstep;
      }
      if (local_e8.refcount != (int *)0x0) {
        LOCK();
        *local_e8.refcount = *local_e8.refcount + -1;
        UNLOCK();
        if (*local_e8.refcount == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            free(local_e8.data);
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar19 = this->ndim;
    }
    if (iVar19 == 3) {
      Mat::reshape(&local_e8,bottom_blob,_w,_h,_c,opt->blob_allocator);
      if (&local_e8 != top_blob) {
        if (local_e8.refcount != (int *)0x0) {
          LOCK();
          *local_e8.refcount = *local_e8.refcount + 1;
          UNLOCK();
        }
        piVar32 = top_blob->refcount;
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_e8.data;
        top_blob->refcount = local_e8.refcount;
        top_blob->elemsize = local_e8.elemsize;
        top_blob->elempack = local_e8.elempack;
        top_blob->allocator = local_e8.allocator;
        top_blob->dims = local_e8.dims;
        top_blob->w = local_e8.w;
        top_blob->h = local_e8.h;
        top_blob->d = local_e8.d;
        top_blob->c = local_e8.c;
        top_blob->cstep = local_e8.cstep;
      }
      if (local_e8.refcount != (int *)0x0) {
        LOCK();
        *local_e8.refcount = *local_e8.refcount + -1;
        UNLOCK();
        if (*local_e8.refcount == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            free(local_e8.data);
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      iVar19 = this->ndim;
    }
    if (iVar19 == 4) {
      Mat::reshape(&local_e8,bottom_blob,_w,_h,iVar24,_c,opt->blob_allocator);
      if (&local_e8 != top_blob) {
        if (local_e8.refcount != (int *)0x0) {
          LOCK();
          *local_e8.refcount = *local_e8.refcount + 1;
          UNLOCK();
        }
        piVar32 = top_blob->refcount;
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 == 0) {
            if (top_blob->allocator == (Allocator *)0x0) {
              free(top_blob->data);
            }
            else {
              (*top_blob->allocator->_vptr_Allocator[3])();
            }
          }
        }
        top_blob->data = local_e8.data;
        top_blob->refcount = local_e8.refcount;
        top_blob->elemsize = local_e8.elemsize;
        top_blob->elempack = local_e8.elempack;
        top_blob->allocator = local_e8.allocator;
        top_blob->dims = local_e8.dims;
        top_blob->w = local_e8.w;
        top_blob->h = local_e8.h;
        top_blob->d = local_e8.d;
        top_blob->c = local_e8.c;
        top_blob->cstep = local_e8.cstep;
      }
      if (local_e8.refcount != (int *)0x0) {
        LOCK();
        *local_e8.refcount = *local_e8.refcount + -1;
        UNLOCK();
        if (*local_e8.refcount == 0) {
          if (local_e8.allocator == (Allocator *)0x0) {
            free(local_e8.data);
          }
          else {
            (*(local_e8.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
      return 0;
    }
    return -100;
  }
  local_e8.data = bottom_blob->data;
  local_e8.refcount = bottom_blob->refcount;
  local_e8.elempack = bottom_blob->elempack;
  local_e8.allocator = bottom_blob->allocator;
  local_e8.cstep = bottom_blob->cstep;
  if (local_e8.refcount != (int *)0x0) {
    LOCK();
    *local_e8.refcount = *local_e8.refcount + 1;
    UNLOCK();
  }
  iVar19 = -100;
  local_e8.elemsize = sVar16;
  local_e8.dims = iVar10;
  local_e8.w = uVar17;
  local_e8.h = uVar28;
  local_e8.d = uVar1;
  local_e8.c = uVar2;
  if (iVar10 == 2) {
    uVar17 = bottom_blob->w;
    uVar28 = bottom_blob->h;
    Mat::create(&local_e8,uVar28,uVar17,sVar16,opt->workspace_allocator);
    if (((undefined4 *)local_e8.data == (undefined4 *)0x0) ||
       ((long)local_e8.c * local_e8.cstep == 0)) goto LAB_002fbaf4;
    puVar21 = (undefined4 *)bottom_blob->data;
    uVar20 = 0;
    uVar15 = (ulong)uVar28;
    if ((int)uVar28 < 1) {
      uVar15 = uVar20;
    }
    puVar27 = (undefined4 *)local_e8.data;
    uVar23 = (ulong)uVar17;
    if ((int)uVar17 < 1) {
      uVar23 = uVar20;
    }
    for (; puVar30 = puVar21, uVar11 = uVar15, uVar20 != uVar23; uVar20 = uVar20 + 1) {
      while (uVar11 != 0) {
        *puVar27 = *puVar30;
        puVar27 = puVar27 + 1;
        puVar30 = puVar30 + (int)uVar17;
        uVar11 = uVar11 - 1;
      }
      puVar21 = puVar21 + 1;
    }
  }
  if (iVar10 == 3) {
    uVar17 = bottom_blob->w;
    uVar28 = bottom_blob->h;
    uVar1 = bottom_blob->c;
    Mat::create(&local_e8,uVar1,uVar17,uVar28,sVar16,opt->workspace_allocator);
    if (((undefined4 *)local_e8.data != (undefined4 *)0x0) &&
       ((long)local_e8.c * local_e8.cstep != 0)) {
      uVar20 = 0;
      uVar15 = (ulong)uVar1;
      if ((int)uVar1 < 1) {
        uVar15 = uVar20;
      }
      uVar23 = (ulong)uVar17;
      if ((int)uVar17 < 1) {
        uVar23 = uVar20;
      }
      uVar11 = (ulong)uVar28;
      if ((int)uVar28 < 1) {
        uVar11 = uVar20;
      }
      for (; uVar20 != uVar11; uVar20 = uVar20 + 1) {
        puVar21 = (undefined4 *)(local_e8.cstep * local_e8.elemsize * uVar20 + (long)local_e8.data);
        lVar22 = 0;
        for (uVar25 = 0; uVar25 != uVar23; uVar25 = uVar25 + 1) {
          sVar16 = bottom_blob->elemsize;
          puVar27 = (undefined4 *)
                    (uVar20 * sVar16 * (long)bottom_blob->w + lVar22 + (long)bottom_blob->data);
          sVar33 = bottom_blob->cstep;
          uVar29 = uVar15;
          while (bVar34 = uVar29 != 0, uVar29 = uVar29 - 1, bVar34) {
            *puVar21 = *puVar27;
            puVar21 = puVar21 + 1;
            puVar27 = (undefined4 *)((long)puVar27 + sVar16 * sVar33);
          }
          lVar22 = lVar22 + 4;
        }
      }
      goto LAB_002fada9;
    }
LAB_002fbaee:
    iVar19 = -100;
    goto LAB_002fbaf4;
  }
LAB_002fada9:
  if (iVar10 == 4) {
    uVar17 = bottom_blob->w;
    uVar28 = bottom_blob->h;
    uVar1 = bottom_blob->d;
    uVar2 = bottom_blob->c;
    Mat::create(&local_e8,uVar2,uVar17,uVar28,uVar1,local_88,opt->workspace_allocator);
    if (((undefined4 *)local_e8.data == (undefined4 *)0x0) ||
       ((long)local_e8.c * local_e8.cstep == 0)) goto LAB_002fbaee;
    uVar20 = 0;
    uVar15 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar15 = uVar20;
    }
    uVar23 = (ulong)uVar17;
    if ((int)uVar17 < 1) {
      uVar23 = uVar20;
    }
    uVar11 = (ulong)uVar28;
    if ((int)uVar28 < 1) {
      uVar11 = uVar20;
    }
    uVar25 = (ulong)uVar1;
    if ((int)uVar1 < 1) {
      uVar25 = uVar20;
    }
    for (; uVar20 != uVar25; uVar20 = uVar20 + 1) {
      puVar21 = (undefined4 *)(local_e8.cstep * local_e8.elemsize * uVar20 + (long)local_e8.data);
      for (uVar29 = 0; uVar29 != uVar11; uVar29 = uVar29 + 1) {
        lVar22 = 0;
        for (uVar26 = 0; uVar26 != uVar23; uVar26 = uVar26 + 1) {
          sVar16 = bottom_blob->elemsize;
          puVar27 = (undefined4 *)
                    ((long)bottom_blob->w * sVar16 * ((long)bottom_blob->h * uVar20 + uVar29) +
                     lVar22 + (long)bottom_blob->data);
          sVar33 = bottom_blob->cstep;
          uVar31 = uVar15;
          while (bVar34 = uVar31 != 0, uVar31 = uVar31 - 1, bVar34) {
            *puVar21 = *puVar27;
            puVar21 = puVar21 + 1;
            puVar27 = (undefined4 *)((long)puVar27 + sVar16 * sVar33);
          }
          lVar22 = lVar22 + 4;
        }
      }
    }
  }
  uVar17 = local_9c;
  iVar10 = this->ndim;
  if (iVar10 == 2) {
    Mat::reshape(&local_80,&local_e8,_h,local_9c,opt->workspace_allocator);
    sVar33 = local_80.cstep;
    iVar19 = local_80.c;
    pAVar14 = local_80.allocator;
    sVar16 = local_80.elemsize;
    if (local_80.refcount == (int *)0x0) {
      piVar32 = (int *)0x0;
    }
    else {
      LOCK();
      *local_80.refcount = *local_80.refcount + 1;
      UNLOCK();
      piVar32 = local_80.refcount;
    }
    local_118 = (undefined4 *)local_80.data;
    if (piVar32 != (int *)0x0) {
      LOCK();
      *piVar32 = *piVar32 + -1;
      UNLOCK();
      if (*piVar32 == 0) {
        if (local_80.allocator == (Allocator *)0x0) {
          free(local_80.data);
        }
        else {
          (*(local_80.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar10 = this->ndim;
  }
  else {
    sVar33 = 0;
    iVar19 = 0;
    pAVar14 = (Allocator *)0x0;
    sVar16 = 0;
    piVar32 = (int *)0x0;
    local_118 = (undefined4 *)0x0;
    if (iVar10 == 1) {
      Mat::reshape(&local_80,&local_e8,local_9c,opt->blob_allocator);
      pMVar7 = local_90;
      if (&local_80 != local_90) {
        if (local_80.refcount != (int *)0x0) {
          LOCK();
          *local_80.refcount = *local_80.refcount + 1;
          UNLOCK();
        }
        piVar32 = local_90->refcount;
        if (piVar32 != (int *)0x0) {
          LOCK();
          *piVar32 = *piVar32 + -1;
          UNLOCK();
          if (*piVar32 == 0) {
            if (local_90->allocator == (Allocator *)0x0) {
              free(local_90->data);
            }
            else {
              (*local_90->allocator->_vptr_Allocator[3])();
            }
          }
        }
        pMVar7->data = local_80.data;
        pMVar7->refcount = local_80.refcount;
        pMVar7->elemsize = local_80.elemsize;
        pMVar7->elempack = local_80.elempack;
        pMVar7->allocator = local_80.allocator;
        pMVar7->dims = local_80.dims;
        pMVar7->w = local_80.w;
        pMVar7->h = local_80.h;
        pMVar7->d = local_80.d;
        pMVar7->c = local_80.c;
        pMVar7->cstep = local_80.cstep;
      }
      if (local_80.refcount != (int *)0x0) {
        LOCK();
        *local_80.refcount = *local_80.refcount + -1;
        UNLOCK();
        if (*local_80.refcount == 0) {
          if (local_80.allocator == (Allocator *)0x0) {
            free(local_80.data);
          }
          else {
            (*(local_80.allocator)->_vptr_Allocator[3])();
          }
        }
      }
      if ((pMVar7->data != (void *)0x0) && (iVar19 = 0, (long)pMVar7->c * pMVar7->cstep != 0))
      goto LAB_002fbaf4;
      goto LAB_002fbaee;
    }
  }
  if (iVar10 == 3) {
    local_98 = pAVar14;
    Mat::reshape(&local_80,&local_e8,_c,uVar17,_h,opt->workspace_allocator);
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + 1;
      UNLOCK();
    }
    if (piVar32 != (int *)0x0) {
      LOCK();
      *piVar32 = *piVar32 + -1;
      UNLOCK();
      if (*piVar32 == 0) {
        if (local_98 == (Allocator *)0x0) {
          free(local_118);
        }
        else {
          (*local_98->_vptr_Allocator[3])(local_98,local_118);
        }
      }
    }
    sVar33 = local_80.cstep;
    iVar19 = local_80.c;
    pAVar14 = local_80.allocator;
    sVar16 = local_80.elemsize;
    piVar32 = local_80.refcount;
    local_118 = (undefined4 *)local_80.data;
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + -1;
      UNLOCK();
      if (*local_80.refcount == 0) {
        if (local_80.allocator == (Allocator *)0x0) {
          free(local_80.data);
        }
        else {
          (*(local_80.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    iVar10 = this->ndim;
  }
  local_98 = pAVar14;
  if (iVar10 == 4) {
    Mat::reshape(&local_80,&local_e8,_c,uVar17,_h,iVar24,opt->workspace_allocator);
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + 1;
      UNLOCK();
    }
    if (piVar32 != (int *)0x0) {
      LOCK();
      *piVar32 = *piVar32 + -1;
      UNLOCK();
      if (*piVar32 == 0) {
        if (local_98 == (Allocator *)0x0) {
          free(local_118);
        }
        else {
          (*local_98->_vptr_Allocator[3])(local_98,local_118);
        }
      }
    }
    local_118 = (undefined4 *)local_80.data;
    local_98 = local_80.allocator;
    sVar16 = local_80.elemsize;
    piVar32 = local_80.refcount;
    sVar33 = local_80.cstep;
    iVar19 = local_80.c;
    if (local_80.refcount != (int *)0x0) {
      LOCK();
      *local_80.refcount = *local_80.refcount + -1;
      UNLOCK();
      if (*local_80.refcount == 0) {
        if (local_80.allocator == (Allocator *)0x0) {
          free(local_80.data);
        }
        else {
          (*(local_80.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  pMVar7 = local_90;
  if ((local_118 == (undefined4 *)0x0) || ((long)iVar19 * sVar33 == 0)) {
LAB_002fb8ad:
    iVar19 = -100;
  }
  else {
    iVar10 = this->ndim;
    if (iVar10 == 2) {
      Mat::create(local_90,uVar17,_h,local_88,opt->blob_allocator);
      puVar21 = (undefined4 *)pMVar7->data;
      if ((puVar21 != (undefined4 *)0x0) && ((long)pMVar7->c * pMVar7->cstep != 0)) {
        uVar15 = 0;
        uVar20 = 0;
        if (0 < (int)uVar17) {
          uVar20 = (ulong)uVar17;
        }
        uVar23 = 0;
        puVar27 = local_118;
        if (0 < (int)_h) {
          uVar23 = (ulong)_h;
        }
        for (; puVar30 = puVar27, uVar11 = uVar20, uVar15 != uVar23; uVar15 = uVar15 + 1) {
          while (uVar11 != 0) {
            *puVar21 = *puVar30;
            puVar21 = puVar21 + 1;
            puVar30 = puVar30 + (int)_h;
            uVar11 = uVar11 - 1;
          }
          puVar27 = puVar27 + 1;
        }
        iVar10 = this->ndim;
        goto LAB_002fb7af;
      }
      iVar19 = -100;
    }
    else {
LAB_002fb7af:
      pMVar7 = local_90;
      if (iVar10 == 3) {
        Mat::create(local_90,uVar17,_h,_c,local_88,opt->blob_allocator);
        pvVar3 = pMVar7->data;
        if (pvVar3 != (void *)0x0) {
          sVar4 = pMVar7->cstep;
          if ((long)pMVar7->c * sVar4 == 0) goto LAB_002fb8ad;
          sVar5 = pMVar7->elemsize;
          uVar20 = 0;
          uVar15 = 0;
          if (0 < (int)uVar17) {
            uVar15 = (ulong)uVar17;
          }
          uVar23 = 0;
          if (0 < (int)_h) {
            uVar23 = (ulong)_h;
          }
          local_38 = 0;
          if (0 < (int)_c) {
            local_38 = (ulong)_c;
          }
          puVar21 = local_118;
          for (; uVar20 != local_38; uVar20 = uVar20 + 1) {
            puVar30 = (undefined4 *)(sVar4 * sVar5 * uVar20 + (long)pvVar3);
            puVar27 = puVar21;
            for (uVar11 = 0; puVar18 = puVar27, uVar25 = uVar15, uVar11 != uVar23;
                uVar11 = uVar11 + 1) {
              while (uVar25 != 0) {
                *puVar30 = *puVar18;
                puVar30 = puVar30 + 1;
                puVar18 = puVar18 + (int)_c;
                uVar25 = uVar25 - 1;
              }
              puVar27 = (undefined4 *)((long)puVar27 + sVar16 * sVar33);
            }
            puVar21 = puVar21 + 1;
            uVar17 = local_9c;
          }
          iVar10 = this->ndim;
          goto LAB_002fb8c9;
        }
LAB_002fb9fb:
        iVar19 = -100;
      }
      else {
LAB_002fb8c9:
        pMVar7 = local_90;
        iVar19 = 0;
        if (iVar10 == 4) {
          Mat::create(local_90,uVar17,_h,iVar24,_c,local_88,opt->blob_allocator);
          pvVar3 = pMVar7->data;
          iVar19 = -100;
          if (pvVar3 == (void *)0x0) goto LAB_002fb9fb;
          sVar4 = pMVar7->cstep;
          if ((long)pMVar7->c * sVar4 != 0) {
            sVar5 = local_90->elemsize;
            iVar19 = 0;
            uVar15 = 0;
            if (0 < (int)uVar17) {
              uVar15 = (ulong)uVar17;
            }
            if ((int)_h < 1) {
              _h = 0;
            }
            if (iVar24 < 1) {
              local_108 = 0;
            }
            uVar20 = 0;
            if (0 < (int)_c) {
              uVar20 = (ulong)_c;
            }
            for (uVar23 = 0; uVar23 != uVar20; uVar23 = uVar23 + 1) {
              puVar21 = (undefined4 *)(sVar4 * sVar5 * uVar23 + (long)pvVar3);
              for (uVar11 = 0; uVar11 != local_108; uVar11 = uVar11 + 1) {
                uVar25 = uVar23 & 0xffffffff;
                for (uVar28 = 0; uVar28 != _h; uVar28 = uVar28 + 1) {
                  iVar10 = (int)uVar25;
                  uVar29 = uVar15;
                  while (bVar34 = uVar29 != 0, uVar29 = uVar29 - 1, bVar34) {
                    *puVar21 = *(undefined4 *)
                                ((long)local_118 + (long)(int)uVar25 * 4 + sVar16 * sVar33 * uVar11)
                    ;
                    puVar21 = puVar21 + 1;
                    uVar25 = (ulong)((int)uVar25 + _c);
                  }
                  uVar25 = (ulong)(iVar10 + uVar17 * _c);
                }
              }
            }
          }
        }
      }
    }
  }
  if (piVar32 != (int *)0x0) {
    LOCK();
    *piVar32 = *piVar32 + -1;
    UNLOCK();
    if (*piVar32 == 0) {
      if (local_98 == (Allocator *)0x0) {
        free(local_118);
      }
      else {
        (*local_98->_vptr_Allocator[3])(local_98,local_118);
      }
    }
  }
LAB_002fbaf4:
  if (local_e8.refcount != (int *)0x0) {
    LOCK();
    *local_e8.refcount = *local_e8.refcount + -1;
    UNLOCK();
    if (*local_e8.refcount == 0) {
      if (local_e8.allocator == (Allocator *)0x0) {
        free(local_e8.data);
      }
      else {
        (*(local_e8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return iVar19;
}

Assistant:

int Reshape::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    size_t elemsize = bottom_blob.elemsize;
    int total = bottom_blob.w * bottom_blob.h * bottom_blob.d * bottom_blob.c;

    int dims = bottom_blob.dims;

    // resolve out shape

    int outw = w;
    int outh = h;
    int outd = d;
    int outc = c;

    if (ndim == 1)
    {
        if (outw == 0)
            outw = bottom_blob.w;

        if (outw == -1)
            outw = total;

        if (dims == 1 && bottom_blob.w == outw)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }
    if (ndim == 2)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;

        if (outw == -1)
            outw = total / outh;
        if (outh == -1)
            outh = total / outw;

        if (dims == 2 && bottom_blob.h == outh)
        {
            top_blob = bottom_blob;
            return 0;
        }
    }
    if (ndim == 3)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;
        if (outc == 0)
            outc = bottom_blob.c;

        if (outw == -1)
            outw = total / outc / outh;
        if (outh == -1)
            outh = total / outc / outw;
        if (outc == -1)
            outc = total / outh / outw;

        if (dims == 3 && bottom_blob.c == outc)
        {
            top_blob = bottom_blob;
            top_blob.w = outw;
            top_blob.h = outh;
            return 0;
        }
    }
    if (ndim == 4)
    {
        if (outw == 0)
            outw = bottom_blob.w;
        if (outh == 0)
            outh = bottom_blob.h;
        if (outc == 0)
            outc = bottom_blob.c;
        if (outd == 0)
            outd = bottom_blob.d;

        if (outw == -1)
            outw = total / outc / outd / outh;
        if (outh == -1)
            outh = total / outc / outd / outw;
        if (outd == -1)
            outd = total / outc / outh / outw;
        if (outc == -1)
            outc = total / outd / outh / outw;

        if (dims == 4 && bottom_blob.c == outc)
        {
            top_blob = bottom_blob;
            top_blob.w = outw;
            top_blob.h = outh;
            top_blob.d = outd;
            return 0;
        }
    }

    bool need_permute = permute == 1;
    if (dims == 2 && ndim == 2 && bottom_blob.h == outh)
        need_permute = false;
    if (dims == 3 && ndim == 3 && bottom_blob.c == outc)
        need_permute = false;
    if (dims == 4 && ndim == 4 && bottom_blob.c == outc)
        need_permute = false;

    if (need_permute)
    {
        Mat bottom_blob_permuted = bottom_blob;

        if (dims == 2)
        {
            // hw -> wh
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;

            bottom_blob_permuted.create(_h, _w, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            const float* ptr = bottom_blob;
            float* outptr = bottom_blob_permuted;

            for (int i = 0; i < _w; i++)
            {
                for (int j = 0; j < _h; j++)
                {
                    *outptr++ = ptr[j * _w + i];
                }
            }
        }
        if (dims == 3)
        {
            // chw -> hwc
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;
            int channels = bottom_blob.c;

            bottom_blob_permuted.create(channels, _w, _h, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < _h; q++)
            {
                float* outptr = bottom_blob_permuted.channel(q);

                for (int i = 0; i < _w; i++)
                {
                    for (int j = 0; j < channels; j++)
                    {
                        *outptr++ = bottom_blob.channel(j).row(q)[i];
                    }
                }
            }
        }

        if (dims == 4)
        {
            // cdhw -> dhwc
            int _w = bottom_blob.w;
            int _h = bottom_blob.h;
            int _d = bottom_blob.d;
            int channels = bottom_blob.c;

            bottom_blob_permuted.create(channels, _w, _h, _d, elemsize, opt.workspace_allocator);
            if (bottom_blob_permuted.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int z = 0; z < _d; z++)
            {
                float* outptr = bottom_blob_permuted.channel(z);

                for (int q = 0; q < _h; q++)
                {
                    for (int i = 0; i < _w; i++)
                    {
                        for (int j = 0; j < channels; j++)
                        {
                            *outptr++ = bottom_blob.channel(j).depth(z).row(q)[i];
                        }
                    }
                }
            }
        }

        if (ndim == 1)
        {
            top_blob = bottom_blob_permuted.reshape(outw, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            return 0;
        }

        // permute on ndhwc/nhwc/nhc
        Mat top_blob_permuted;
        if (ndim == 2)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outh, outw, opt.workspace_allocator);
        }
        if (ndim == 3)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outc, outw, outh, opt.workspace_allocator);
        }
        if (ndim == 4)
        {
            top_blob_permuted = bottom_blob_permuted.reshape(outc, outw, outh, outd, opt.workspace_allocator);
        }
        if (top_blob_permuted.empty())
            return -100;

        if (ndim == 2)
        {
            // wh -> hw
            top_blob.create(outw, outh, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            const float* ptr = top_blob_permuted;
            float* outptr = top_blob;

            for (int i = 0; i < outh; i++)
            {
                for (int j = 0; j < outw; j++)
                {
                    *outptr++ = ptr[j * outh + i];
                }
            }
        }
        if (ndim == 3)
        {
            // hwc -> chw
            top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < outh; i++)
                {
                    const float* ptr = top_blob_permuted.channel(i);

                    for (int j = 0; j < outw; j++)
                    {
                        *outptr++ = ptr[j * outc + q];
                    }
                }
            }
        }
        if (ndim == 4)
        {
            // dhwc -> cdhw
            top_blob.create(outw, outh, outd, outc, elemsize, opt.blob_allocator);
            if (top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < outc; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int k = 0; k < outd; k++)
                {
                    const float* ptr = top_blob_permuted.channel(k);

                    for (int i = 0; i < outh; i++)
                    {
                        for (int j = 0; j < outw; j++)
                        {
                            *outptr++ = ptr[i * outw * outc + j * outc + q];
                        }
                    }
                }
            }
        }

        return 0;
    }

    if (ndim == 1)
    {
        top_blob = bottom_blob.reshape(outw, opt.blob_allocator);
    }
    if (ndim == 2)
    {
        top_blob = bottom_blob.reshape(outw, outh, opt.blob_allocator);
    }
    if (ndim == 3)
    {
        top_blob = bottom_blob.reshape(outw, outh, outc, opt.blob_allocator);
    }
    if (ndim == 4)
    {
        top_blob = bottom_blob.reshape(outw, outh, outd, outc, opt.blob_allocator);
    }
    if (top_blob.empty())
        return -100;

    return 0;
}